

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

void blowfish_expandkey(BlowfishContext *ctx,void *vkey,short keybytes,void *vsalt,short saltbytes)

{
  undefined1 local_7d;
  int local_7c;
  int iStack_78;
  uchar dummysalt [1];
  int saltpos;
  int j;
  int i;
  uint32_t str [2];
  uint32_t *P;
  uint32_t *S3;
  uint32_t *S2;
  uint32_t *S1;
  uint32_t *S0;
  uchar *salt;
  uchar *key;
  short saltbytes_local;
  void *vsalt_local;
  short keybytes_local;
  void *vkey_local;
  BlowfishContext *ctx_local;
  
  str = (uint32_t  [2])ctx->P;
  local_7c = 0;
  S0 = (uint32_t *)vsalt;
  key._6_2_ = saltbytes;
  if (vsalt == (void *)0x0) {
    key._6_2_ = 1;
    S0 = (uint32_t *)&local_7d;
    local_7d = 0;
  }
  for (saltpos = 0; saltpos < 0x12; saltpos = saltpos + 1) {
    *(uint *)((long)str + (long)saltpos * 4) =
         (uint)*(byte *)((long)vkey + (long)((saltpos << 2) % (int)keybytes)) << 0x18 ^
         *(uint32_t *)((long)str + (long)saltpos * 4);
    *(uint *)((long)str + (long)saltpos * 4) =
         (uint)*(byte *)((long)vkey + (long)((saltpos * 4 + 1) % (int)keybytes)) << 0x10 ^
         *(uint32_t *)((long)str + (long)saltpos * 4);
    *(uint *)((long)str + (long)saltpos * 4) =
         (uint)*(byte *)((long)vkey + (long)((saltpos * 4 + 2) % (int)keybytes)) << 8 ^
         *(uint32_t *)((long)str + (long)saltpos * 4);
    *(uint *)((long)str + (long)saltpos * 4) =
         (uint)*(byte *)((long)vkey + (long)((saltpos * 4 + 3) % (int)keybytes)) ^
         *(uint32_t *)((long)str + (long)saltpos * 4);
  }
  i = 0;
  j = 0;
  for (saltpos = 0; saltpos < 0x12; saltpos = saltpos + 2) {
    for (iStack_78 = 0; iStack_78 < 8; iStack_78 = iStack_78 + 1) {
      (&j)[iStack_78 / 4] =
           (uint)*(byte *)((long)S0 + (long)(local_7c % (int)key._6_2_)) <<
           ((char)(iStack_78 % 4) * -8 + 0x18U & 0x1f) ^ (&j)[iStack_78 / 4];
      local_7c = local_7c + 1;
    }
    blowfish_encrypt(j,i,(uint32_t *)&j,ctx);
    *(int *)((long)str + (long)saltpos * 4) = j;
    *(int *)((long)str + (long)(saltpos + 1) * 4) = i;
  }
  for (saltpos = 0; saltpos < 0x100; saltpos = saltpos + 2) {
    for (iStack_78 = 0; iStack_78 < 8; iStack_78 = iStack_78 + 1) {
      (&j)[iStack_78 / 4] =
           (uint)*(byte *)((long)S0 + (long)(local_7c % (int)key._6_2_)) <<
           ((char)(iStack_78 % 4) * -8 + 0x18U & 0x1f) ^ (&j)[iStack_78 / 4];
      local_7c = local_7c + 1;
    }
    blowfish_encrypt(j,i,(uint32_t *)&j,ctx);
    ctx->S0[saltpos] = j;
    ctx->S0[saltpos + 1] = i;
  }
  for (saltpos = 0; saltpos < 0x100; saltpos = saltpos + 2) {
    for (iStack_78 = 0; iStack_78 < 8; iStack_78 = iStack_78 + 1) {
      (&j)[iStack_78 / 4] =
           (uint)*(byte *)((long)S0 + (long)(local_7c % (int)key._6_2_)) <<
           ((char)(iStack_78 % 4) * -8 + 0x18U & 0x1f) ^ (&j)[iStack_78 / 4];
      local_7c = local_7c + 1;
    }
    blowfish_encrypt(j,i,(uint32_t *)&j,ctx);
    ctx->S1[saltpos] = j;
    ctx->S1[saltpos + 1] = i;
  }
  for (saltpos = 0; saltpos < 0x100; saltpos = saltpos + 2) {
    for (iStack_78 = 0; iStack_78 < 8; iStack_78 = iStack_78 + 1) {
      (&j)[iStack_78 / 4] =
           (uint)*(byte *)((long)S0 + (long)(local_7c % (int)key._6_2_)) <<
           ((char)(iStack_78 % 4) * -8 + 0x18U & 0x1f) ^ (&j)[iStack_78 / 4];
      local_7c = local_7c + 1;
    }
    blowfish_encrypt(j,i,(uint32_t *)&j,ctx);
    ctx->S2[saltpos] = j;
    ctx->S2[saltpos + 1] = i;
  }
  for (saltpos = 0; saltpos < 0x100; saltpos = saltpos + 2) {
    for (iStack_78 = 0; iStack_78 < 8; iStack_78 = iStack_78 + 1) {
      (&j)[iStack_78 / 4] =
           (uint)*(byte *)((long)S0 + (long)(local_7c % (int)key._6_2_)) <<
           ((char)(iStack_78 % 4) * -8 + 0x18U & 0x1f) ^ (&j)[iStack_78 / 4];
      local_7c = local_7c + 1;
    }
    blowfish_encrypt(j,i,(uint32_t *)&j,ctx);
    ctx->S3[saltpos] = j;
    ctx->S3[saltpos + 1] = i;
  }
  return;
}

Assistant:

void blowfish_expandkey(BlowfishContext * ctx,
                        const void *vkey, short keybytes,
                        const void *vsalt, short saltbytes)
{
    const unsigned char *key = (const unsigned char *)vkey;
    const unsigned char *salt = (const unsigned char *)vsalt;
    uint32_t *S0 = ctx->S0;
    uint32_t *S1 = ctx->S1;
    uint32_t *S2 = ctx->S2;
    uint32_t *S3 = ctx->S3;
    uint32_t *P = ctx->P;
    uint32_t str[2];
    int i, j;
    int saltpos;
    unsigned char dummysalt[1];

    saltpos = 0;
    if (!salt) {
        saltbytes = 1;
        salt = dummysalt;
        dummysalt[0] = 0;
    }

    for (i = 0; i < 18; i++) {
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 0) % keybytes])) << 24;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 1) % keybytes])) << 16;
        P[i] ^=
            ((uint32_t) (unsigned char) (key[(i * 4 + 2) % keybytes])) << 8;
        P[i] ^= ((uint32_t) (unsigned char) (key[(i * 4 + 3) % keybytes]));
    }

    str[0] = str[1] = 0;

    for (i = 0; i < 18; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));

        blowfish_encrypt(str[0], str[1], str, ctx);
        P[i] = str[0];
        P[i + 1] = str[1];
    }

    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S0[i] = str[0];
        S0[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S1[i] = str[0];
        S1[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S2[i] = str[0];
        S2[i + 1] = str[1];
    }
    for (i = 0; i < 256; i += 2) {
        for (j = 0; j < 8; j++)
            str[j/4] ^= ((uint32_t)salt[saltpos++ % saltbytes]) << (24-8*(j%4));
        blowfish_encrypt(str[0], str[1], str, ctx);
        S3[i] = str[0];
        S3[i + 1] = str[1];
    }
}